

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
               (string *s,char *fmt,optional<int> *v,bool *args,bool *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               optional<pbrt::Bounds2<float>_> *args_7,optional<pbrt::Bounds2<int>_> *args_8,
               optional<pbrt::Point2<int>_> *args_9,float *args_10)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *fmt_00;
  ulong uVar4;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R13;
  bool *unaff_R14;
  bool *unaff_R15;
  char *unaff_retaddr;
  string *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  optional<pbrt::Bounds2<float>_> *in_stack_00000058;
  optional<pbrt::Bounds2<int>_> *in_stack_00000060;
  optional<pbrt::Point2<int>_> *in_stack_00000068;
  float *in_stack_00000070;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  optional<int> *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  optional<int> *in_stack_fffffffffffffd50;
  ostream *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  char **in_stack_fffffffffffffd68;
  char **in_stack_fffffffffffffd70;
  string local_280 [32];
  string local_260 [32];
  undefined8 local_240;
  string local_238 [32];
  char *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  string local_78 [72];
  string *local_30;
  
  local_30 = in_RDI;
  copyToFormatString(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  lVar1 = std::__cxx11::string::find((char)local_78,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_78,0x73);
  lVar3 = std::__cxx11::string::find((char)local_78,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8);
    }
    std::__cxx11::string::c_str();
    formatOne<pstd::optional<int>const&>(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::__cxx11::string::operator+=(local_30,local_280);
    std::__cxx11::string::~string(local_280);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde8);
    pstd::operator<<(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    fmt_00 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_240 = std::__cxx11::string::c_str();
    formatOne<char_const*>(fmt_00,in_stack_fffffffffffffd70);
    std::__cxx11::string::operator+=(local_30,local_238);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffde8);
  }
  stringPrintfRecursive<bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
            (in_stack_00000008,unaff_retaddr,unaff_R15,unaff_R14,unaff_R13,unaff_R12,
             in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058,
             in_stack_00000060,in_stack_00000068,in_stack_00000070);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}